

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O2

void verify_min_dfs(log_multi *b,node *node)

{
  ulong uVar1;
  ostream *poVar2;
  node *pnVar3;
  uint uVar4;
  
  for (; node->internal == true; node = (b->nodes)._begin + node->right) {
    uVar1 = (ulong)node->left;
    pnVar3 = (b->nodes)._begin;
    uVar4 = pnVar3[uVar1].min_count;
    if (pnVar3[node->right].min_count < pnVar3[uVar1].min_count) {
      uVar4 = pnVar3[node->right].min_count;
    }
    if (node->min_count != uVar4) {
      poVar2 = std::operator<<((ostream *)&std::cout,"badness! ");
      std::endl<char,std::char_traits<char>>(poVar2);
      display_tree_dfs(b,(b->nodes)._begin,0);
      uVar1 = (ulong)node->left;
      pnVar3 = (b->nodes)._begin;
    }
    verify_min_dfs(b,pnVar3 + uVar1);
  }
  return;
}

Assistant:

void verify_min_dfs(log_multi& b, const node& node)
{
  if (node.internal)
  {
    if (node.min_count != min_left_right(b, node))
    {
      cout << "badness! " << endl;
      display_tree_dfs(b, b.nodes[0], 0);
    }
    verify_min_dfs(b, b.nodes[node.left]);
    verify_min_dfs(b, b.nodes[node.right]);
  }
}